

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_record.c
# Opt level: O0

log_record log_record_initialize(log_record record,log_record_ctor record_ctor)

{
  time_t tVar1;
  uint64_t uVar2;
  size_t *in_RSI;
  log_record in_RDI;
  log_record local_8;
  
  if ((in_RDI == (log_record)0x0) || (in_RSI == (size_t *)0x0)) {
    local_8 = (log_record)0x0;
  }
  else {
    tVar1 = time((time_t *)0x0);
    in_RDI->time = tVar1;
    uVar2 = thread_id_get_current();
    in_RDI->id = uVar2;
    in_RDI->line = *in_RSI;
    in_RDI->func = (char *)in_RSI[1];
    in_RDI->file = (char *)in_RSI[2];
    in_RDI->level = *(log_level_id *)(in_RSI + 3);
    in_RDI->message = (char *)in_RSI[4];
    in_RDI->variable_args = (log_record_va_list_type *)in_RSI[5];
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

log_record log_record_initialize(log_record record, const log_record_ctor record_ctor)
{
	if (record != NULL && record_ctor != NULL)
	{
		record->time = time(NULL);
		record->id = thread_id_get_current();
		record->line = record_ctor->line;
		record->func = record_ctor->func;
		record->file = record_ctor->file;
		record->level = record_ctor->level;
		record->message = record_ctor->message;
		record->variable_args = record_ctor->variable_args;

		return record;
	}

	return NULL;
}